

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_function_prototype
          (CompilerGLSL *this,SPIRFunction *func,Bitset *return_flags)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  char *pcVar4;
  spirv_cross local_280 [32];
  SPIRVariable *local_260;
  SPIRVariable *var_1;
  Parameter *local_238;
  Parameter *arg_1;
  Parameter *__end1_1;
  Parameter *__begin1_1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1_1;
  SPIRVariable *var;
  Parameter *local_1f0;
  Parameter *arg;
  Parameter *__end1;
  Parameter *__begin1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__range1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  arglist;
  string local_98 [32];
  string local_78 [48];
  SPIRType *local_48;
  SPIRType *type;
  string decl;
  Bitset *return_flags_local;
  SPIRFunction *func_local;
  CompilerGLSL *this_local;
  
  bVar1 = TypedID<(spirv_cross::Types)0>::operator!=
                    (&(func->super_IVariant).self,&(this->super_Compiler).ir.default_entry_point);
  if (bVar1) {
    add_function_overload(this,func);
  }
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->local_variable_names,&this->resource_names);
  ::std::__cxx11::string::string((string *)&type);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).field_0xc);
  local_48 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  pcVar4 = flags_to_qualifiers_glsl(this,local_48,return_flags);
  ::std::__cxx11::string::operator+=((string *)&type,pcVar4);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_78,this,local_48,0);
  ::std::__cxx11::string::operator+=((string *)&type,local_78);
  ::std::__cxx11::string::~string(local_78);
  (*(this->super_Compiler)._vptr_Compiler[0x23])(local_98,this,local_48);
  ::std::__cxx11::string::operator+=((string *)&type,local_98);
  ::std::__cxx11::string::~string(local_98);
  ::std::__cxx11::string::operator+=((string *)&type," ");
  bVar1 = TypedID<(spirv_cross::Types)0>::operator==
                    (&(func->super_IVariant).self,&(this->super_Compiler).ir.default_entry_point);
  if (bVar1) {
    if (((this->super_Compiler).interlocked_is_complex & 1U) == 0) {
      ::std::__cxx11::string::operator+=((string *)&type,"main");
    }
    else {
      ::std::__cxx11::string::operator+=((string *)&type,"spvMainInterlockedBody");
    }
    this->processing_entry_point = true;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])
              (arglist.stack_storage.aligned_char + 0xf8,this,(ulong)uVar2,1);
    ::std::__cxx11::string::operator+=
              ((string *)&type,(string *)(arglist.stack_storage.aligned_char + 0xf8));
    ::std::__cxx11::string::~string((string *)(arglist.stack_storage.aligned_char + 0xf8));
  }
  ::std::__cxx11::string::operator+=((string *)&type,"(");
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&__range1);
  __begin1 = (Parameter *)&func->arguments;
  __end1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                     ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  arg = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                  ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1);
  for (; __end1 != arg; __end1 = __end1 + 1) {
    local_1f0 = __end1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1->id);
    uVar3 = (*(this->super_Compiler)._vptr_Compiler[0x2f])(this,(ulong)uVar2);
    if ((uVar3 & 1) == 0) {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f0->id);
      add_local_variable_name(this,uVar2);
      argument_decl_abi_cxx11_((CompilerGLSL *)&var,(Parameter *)this);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)&__range1,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var);
      ::std::__cxx11::string::~string((string *)&var);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_1f0->id);
      __range1_1 = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)
                   Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
      if ((SPIRVariable *)__range1_1 != (SPIRVariable *)0x0) {
        ((SPIRVariable *)__range1_1)->parameter = local_1f0;
      }
    }
  }
  __begin1_1 = (Parameter *)&func->shadow_arguments;
  __end1_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::begin
                       ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  arg_1 = VectorView<spirv_cross::SPIRFunction::Parameter>::end
                    ((VectorView<spirv_cross::SPIRFunction::Parameter> *)__begin1_1);
  for (; __end1_1 != arg_1; __end1_1 = __end1_1 + 1) {
    local_238 = __end1_1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end1_1->id);
    add_local_variable_name(this,uVar2);
    argument_decl_abi_cxx11_((CompilerGLSL *)&var_1,(Parameter *)this);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&__range1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&var_1);
    ::std::__cxx11::string::~string((string *)&var_1);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_238->id);
    local_260 = Compiler::maybe_get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
    if (local_260 != (SPIRVariable *)0x0) {
      local_260->parameter = local_238;
    }
  }
  merge(local_280,
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)&__range1,", ");
  ::std::__cxx11::string::operator+=((string *)&type,(string *)local_280);
  ::std::__cxx11::string::~string((string *)local_280);
  ::std::__cxx11::string::operator+=((string *)&type,")");
  statement<std::__cxx11::string&>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                  *)&__range1);
  ::std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void CompilerGLSL::emit_function_prototype(SPIRFunction &func, const Bitset &return_flags)
{
	if (func.self != ir.default_entry_point)
		add_function_overload(func);

	// Avoid shadow declarations.
	local_variable_names = resource_names;

	string decl;

	auto &type = get<SPIRType>(func.return_type);
	decl += flags_to_qualifiers_glsl(type, return_flags);
	decl += type_to_glsl(type);
	decl += type_to_array_glsl(type);
	decl += " ";

	if (func.self == ir.default_entry_point)
	{
		// If we need complex fallback in GLSL, we just wrap main() in a function
		// and interlock the entire shader ...
		if (interlocked_is_complex)
			decl += "spvMainInterlockedBody";
		else
			decl += "main";

		processing_entry_point = true;
	}
	else
		decl += to_name(func.self);

	decl += "(";
	SmallVector<string> arglist;
	for (auto &arg : func.arguments)
	{
		// Do not pass in separate images or samplers if we're remapping
		// to combined image samplers.
		if (skip_argument(arg.id))
			continue;

		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	for (auto &arg : func.shadow_arguments)
	{
		// Might change the variable name if it already exists in this function.
		// SPIRV OpName doesn't have any semantic effect, so it's valid for an implementation
		// to use same name for variables.
		// Since we want to make the GLSL debuggable and somewhat sane, use fallback names for variables which are duplicates.
		add_local_variable_name(arg.id);

		arglist.push_back(argument_decl(arg));

		// Hold a pointer to the parameter so we can invalidate the readonly field if needed.
		auto *var = maybe_get<SPIRVariable>(arg.id);
		if (var)
			var->parameter = &arg;
	}

	decl += merge(arglist);
	decl += ")";
	statement(decl);
}